

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_buffered_out(char *msg,void *arg)

{
  char cVar1;
  long lVar2;
  long in_RSI;
  char *in_RDI;
  char c;
  char *src;
  buffered_t *buf;
  char *local_20;
  
  if ((in_RDI != (char *)0x0) && (local_20 = in_RDI, in_RSI != 0)) {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      cVar1 = *local_20;
      if (*(ulong *)(in_RSI + 0x20) <= *(ulong *)(in_RSI + 0x18)) {
        mi_buffered_flush((buffered_t *)0x465c2d);
      }
      lVar2 = *(long *)(in_RSI + 0x18);
      *(long *)(in_RSI + 0x18) = lVar2 + 1;
      *(char *)(*(long *)(in_RSI + 0x10) + lVar2) = cVar1;
      if (cVar1 == '\n') {
        mi_buffered_flush((buffered_t *)0x465c65);
      }
    }
  }
  return;
}

Assistant:

static void mi_cdecl mi_buffered_out(const char* msg, void* arg) {
  buffered_t* buf = (buffered_t*)arg;
  if (msg==NULL || buf==NULL) return;
  for (const char* src = msg; *src != 0; src++) {
    char c = *src;
    if (buf->used >= buf->count) mi_buffered_flush(buf);
    mi_assert_internal(buf->used < buf->count);
    buf->buf[buf->used++] = c;
    if (c == '\n') mi_buffered_flush(buf);
  }
}